

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  char *pcVar2;
  float *pfVar3;
  uchar *puVar4;
  long lVar5;
  _GLFWjoystickLinux *js;
  int local_130;
  int version;
  int fd;
  int joy;
  char name [256];
  char local_1a;
  char local_19;
  char buttonCount;
  char *pcStack_18;
  char axisCount;
  char *path_local;
  
  pcStack_18 = path;
  memset(&fd,0,0x100);
  version = 0;
  while( true ) {
    if (0xf < version) {
      version = 0;
      while ((version < 0x10 && (_glfw.linux_js.js[version].present != 0))) {
        version = version + 1;
      }
      if (version < 0x10) {
        local_130 = open(pcStack_18,0x800);
        if (local_130 == -1) {
          path_local._4_4_ = 0;
        }
        else {
          ioctl(local_130,0x80046a01,(long)&js + 4);
          if (js._4_4_ < 0x10000) {
            close(local_130);
            path_local._4_4_ = 0;
          }
          else {
            iVar1 = ioctl(local_130,0x81006a13,&fd);
            if (iVar1 < 0) {
              strncpy((char *)&fd,"Unknown",0x100);
            }
            lVar5 = (long)version;
            _glfw.linux_js.js[lVar5].present = 1;
            pcVar2 = strdup((char *)&fd);
            _glfw.linux_js.js[lVar5].name = pcVar2;
            pcVar2 = strdup(pcStack_18);
            _glfw.linux_js.js[lVar5].path = pcVar2;
            _glfw.linux_js.js[lVar5].fd = local_130;
            ioctl(local_130,0x80016a11,&local_19);
            _glfw.linux_js.js[lVar5].axisCount = (int)local_19;
            pfVar3 = (float *)calloc((long)local_19,4);
            _glfw.linux_js.js[lVar5].axes = pfVar3;
            ioctl(local_130,0x80016a12,&local_1a);
            _glfw.linux_js.js[lVar5].buttonCount = (int)local_1a;
            puVar4 = (uchar *)calloc((long)local_1a,1);
            _glfw.linux_js.js[lVar5].buttons = puVar4;
            _glfwInputJoystickChange(version,0x40001);
            path_local._4_4_ = 1;
          }
        }
      }
      else {
        path_local._4_4_ = 0;
      }
      return path_local._4_4_;
    }
    if ((_glfw.linux_js.js[version].present != 0) &&
       (iVar1 = strcmp(_glfw.linux_js.js[version].path,pcStack_18), iVar1 == 0)) break;
    version = version + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    char axisCount, buttonCount;
    char name[256] = "";
    int joy, fd, version;
    _GLFWjoystickLinux* js;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return GLFW_FALSE;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return GLFW_FALSE;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GLFW_FALSE;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GLFW_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    js = _glfw.linux_js.js + joy;
    js->present = GLFW_TRUE;
    js->name = strdup(name);
    js->path = strdup(path);
    js->fd = fd;

    ioctl(fd, JSIOCGAXES, &axisCount);
    js->axisCount = (int) axisCount;
    js->axes = calloc(axisCount, sizeof(float));

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    js->buttonCount = (int) buttonCount;
    js->buttons = calloc(buttonCount, 1);

    _glfwInputJoystickChange(joy, GLFW_CONNECTED);
    return GLFW_TRUE;
}